

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O3

hpdata_t * duckdb_je_hpdata_age_heap_any(hpdata_age_heap_t *ph)

{
  hpdata_t *phVar1;
  hpdata_t *phVar2;
  
  phVar1 = (hpdata_t *)(ph->ph).root;
  if (phVar1 != (hpdata_t *)0x0) {
    phVar2 = (hpdata_t *)(phVar1->field_13).age_link.link.next;
    if (phVar2 == (hpdata_t *)0x0) {
      phVar2 = phVar1;
    }
    return phVar2;
  }
  return (hpdata_t *)0x0;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_any(ph_t *ph, size_t offset) {
	if (ph->root == NULL) {
		return NULL;
	}
	void *aux = phn_next_get(ph->root, offset);
	if (aux != NULL) {
		return aux;
	}
	return ph->root;
}